

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

String * __thiscall
Json::(anonymous_namespace)::valueToString_abi_cxx11_
          (String *__return_storage_ptr__,_anonymous_namespace_ *this,double value,
          bool useSpecialFloats,uint precision,PrecisionType precisionType)

{
  size_type sVar1;
  uint uVar2;
  String *pSVar3;
  pointer pcVar4;
  pointer pcVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  String *pSVar7;
  size_type sVar8;
  long lVar9;
  String *pSVar10;
  char *pcVar11;
  allocator local_31;
  double local_30;
  
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_30 = value;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'$');
    pcVar11 = "%.*f";
    if (precision == 0) {
      pcVar11 = "%.*g";
    }
    while( true ) {
      uVar2 = snprintf((__return_storage_ptr__->_M_dataplus)._M_p,
                       __return_storage_ptr__->_M_string_length,pcVar11,local_30,
                       CONCAT71(in_register_00000011,useSpecialFloats) & 0xffffffff);
      if ((int)uVar2 < 0) {
        __assert_fail("len >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/external/jsoncpp/src/lib_json/json_writer.cpp"
                      ,0x92,
                      "String Json::(anonymous namespace)::valueToString(double, bool, unsigned int, PrecisionType)"
                     );
      }
      if ((ulong)uVar2 < __return_storage_ptr__->_M_string_length) break;
      std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar2 + '\x01');
    }
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar2);
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar1 = __return_storage_ptr__->_M_string_length;
    pcVar5 = pcVar4;
    if (sVar1 != 0) {
      pcVar5 = pcVar4 + sVar1;
      sVar8 = 0;
      do {
        if (pcVar4[sVar8] == ',') {
          pcVar4[sVar8] = '.';
        }
        sVar8 = sVar8 + 1;
      } while (sVar1 != sVar8);
      pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    }
    __return_storage_ptr__->_M_string_length = (long)pcVar5 - (long)pcVar4;
    *pcVar5 = '\0';
    pSVar3 = (String *)std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
    if ((pSVar3 == (String *)0xffffffffffffffff) &&
       (pSVar3 = (String *)std::__cxx11::string::find((char)__return_storage_ptr__,0x65),
       pSVar3 == (String *)0xffffffffffffffff)) {
      pSVar3 = (String *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (precision == 1) {
      pSVar3 = (String *)(__return_storage_ptr__->_M_dataplus)._M_p;
      sVar1 = __return_storage_ptr__->_M_string_length;
      pSVar7 = (String *)((long)&(pSVar3->_M_dataplus)._M_p + sVar1);
      if ((sVar1 != 0) && (pSVar7[-1].field_2._M_local_buf[0xf] == '0')) {
        lVar9 = 0;
        pSVar10 = pSVar3;
        do {
          pSVar7 = pSVar3;
          if (sVar1 - 1 == lVar9) goto LAB_00136513;
          if ((sVar1 - 2 != lVar9) && (*(char *)((long)pSVar10 + (sVar1 - 2)) == '.')) {
            pSVar7 = (String *)((long)pSVar10 + (sVar1 - 2));
            if ((int)CONCAT71(in_register_00000011,useSpecialFloats) != 0) {
              pSVar7 = (String *)((long)&(pSVar10->_M_dataplus)._M_p + sVar1);
            }
            goto LAB_00136513;
          }
          pSVar7 = pSVar10 + -1;
          lVar9 = lVar9 + 1;
          pcVar11 = (char *)((long)pSVar10 + (sVar1 - 2));
          pSVar10 = (String *)((pSVar7->field_2)._M_local_buf + 0xf);
        } while (*pcVar11 == '0');
        pSVar7 = (String *)
                 ((long)&(((String *)((pSVar7->field_2)._M_local_buf + 0xf))->_M_dataplus)._M_p +
                 sVar1);
      }
LAB_00136513:
      __return_storage_ptr__->_M_string_length = (long)pSVar7 - (long)pSVar3;
      *(char *)&(pSVar7->_M_dataplus)._M_p = '\0';
    }
  }
  else {
    uVar6 = 0;
    if (!NAN(value)) {
      uVar6 = (ulong)((0.0 <= value) + 1);
    }
    pSVar3 = (String *)
             std::__cxx11::string::string
                       ((string *)__return_storage_ptr__,
                        anon_unknown_5::valueToString::reps[(byte)((byte)this ^ 1)][uVar6],&local_31
                       );
  }
  return pSVar3;
}

Assistant:

String valueToString(double value, bool useSpecialFloats,
                     unsigned int precision, PrecisionType precisionType) {
  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distinguish the
  // concepts of reals and integers.
  if (!isfinite(value)) {
    static const char* const reps[2][3] = {{"NaN", "-Infinity", "Infinity"},
                                           {"null", "-1e+9999", "1e+9999"}};
    return reps[useSpecialFloats ? 0 : 1][isnan(value)  ? 0
                                          : (value < 0) ? 1
                                                        : 2];
  }

  String buffer(size_t(36), '\0');
  while (true) {
    int len = jsoncpp_snprintf(
        &*buffer.begin(), buffer.size(),
        (precisionType == PrecisionType::significantDigits) ? "%.*g" : "%.*f",
        precision, value);
    assert(len >= 0);
    auto wouldPrint = static_cast<size_t>(len);
    if (wouldPrint >= buffer.size()) {
      buffer.resize(wouldPrint + 1);
      continue;
    }
    buffer.resize(wouldPrint);
    break;
  }

  buffer.erase(fixNumericLocale(buffer.begin(), buffer.end()), buffer.end());

  // try to ensure we preserve the fact that this was given to us as a double on
  // input
  if (buffer.find('.') == buffer.npos && buffer.find('e') == buffer.npos) {
    buffer += ".0";
  }

  // strip the zero padding from the right
  if (precisionType == PrecisionType::decimalPlaces) {
    buffer.erase(fixZerosInTheEnd(buffer.begin(), buffer.end(), precision),
                 buffer.end());
  }

  return buffer;
}